

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

QList<std::pair<double,_QPointF>_> * __thiscall
QGraphicsItemAnimation::posList
          (QList<std::pair<double,_QPointF>_> *__return_storage_ptr__,QGraphicsItemAnimation *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<double,_QPointF> *)0x0;
  uVar4 = *(ulong *)(*(long *)(this + 0x10) + 0x98);
  iVar2 = (int)uVar4;
  QList<std::pair<double,_QPointF>_>::reserve(__return_storage_ptr__,(long)iVar2);
  uVar3 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    lVar1 = *(long *)(*(long *)(this + 0x10) + 0x90);
    local_40.xp = *(qreal *)(lVar1 + 8 + uVar3);
    local_40.yp = *(qreal *)(*(long *)(*(long *)(this + 0x10) + 0xa8) + 8 + uVar3);
    QList<std::pair<double,QPointF>>::emplaceBack<double_const&,QPointF>
              ((QList<std::pair<double,QPointF>> *)__return_storage_ptr__,(double *)(lVar1 + uVar3),
               &local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<qreal, QPointF> > QGraphicsItemAnimation::posList() const
{
    QList<std::pair<qreal, QPointF>> list;
    const int xPosCount = d->xPosition.size();
    list.reserve(xPosCount);
    for (int i = 0; i < xPosCount; ++i)
        list.emplace_back(d->xPosition.at(i).step,
                          QPointF(d->xPosition.at(i).value, d->yPosition.at(i).value));

    return list;
}